

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  Message *pMVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Message local_30;
  wchar_t *in_stack_ffffffffffffffd8;
  
  pMVar1 = &local_30;
  internal::String::ShowWideCString_abi_cxx11_(in_stack_ffffffffffffffd8);
  pMVar1 = operator<<(pMVar1,in_RDI);
  std::__cxx11::string::~string((string *)&local_30);
  return pMVar1;
}

Assistant:

Message& Message::operator <<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}